

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithLoadedTexture_throwIfUsedWrongTextureIdDuringTextureRendering_Test::TestBody
          (SDLGraphicsSystemWithLoadedTexture_throwIfUsedWrongTextureIdDuringTextureRendering_Test
           *this)

{
  bool bVar1;
  AssertHelper local_70;
  long *local_68;
  char *local_60;
  long local_58 [2];
  Message local_48 [4];
  TextureId local_24;
  
  local_58[0] = 0;
  local_58[1] = 0;
  local_60 = (char *)0x0;
  local_68 = local_58;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_24.t = (anonymous_namespace)::textureId1;
    SDLGraphicsSystem::renderTexture
              (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system,
               &local_24,(Position *)&(anonymous_namespace)::texturePosition,
               (Area *)(anonymous_namespace)::textureArea);
  }
  std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,0x28be23);
  testing::Message::Message(local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x152,(char *)local_68);
  testing::internal::AssertHelper::operator=(&local_70,local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_48[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_48[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       throwIfUsedWrongTextureIdDuringTextureRendering)
{
    EXPECT_THROW(
        system.renderTexture(textureId1, texturePosition, textureArea),
        std::runtime_error
    );

    expectQuitSystemWithLoadedTexture();
}